

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O0

bool __thiscall
QSharedMemorySystemV::attach(QSharedMemorySystemV *this,QSharedMemoryPrivate *self,AccessMode mode)

{
  int iVar1;
  void *pvVar2;
  int in_EDX;
  int __shmflg;
  QSharedMemoryPrivate *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int id;
  shmid_ds shmid_ds;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  bool local_79;
  shmid_ds local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = 0x180;
  if (in_EDX == 0) {
    iVar1 = 0x100;
  }
  iVar1 = shmget(*(key_t *)(in_RDI + 0x18),0,iVar1);
  if (iVar1 == -1) {
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    QSharedMemoryPrivate::setUnixErrorString(in_RSI,(QLatin1StringView)shmid_ds.shm_perm._32_16_);
    *(undefined4 *)(in_RDI + 0x18) = 0;
    QByteArray::clear((QByteArray *)0x8d3fed);
    local_79 = false;
  }
  else {
    __shmflg = 0;
    if (in_EDX == 0) {
      __shmflg = 0x1000;
    }
    pvVar2 = shmat(iVar1,(void *)0x0,__shmflg);
    in_RSI->memory = pvVar2;
    if (in_RSI->memory == (void *)0xffffffffffffffff) {
      in_RSI->memory = (void *)0x0;
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_ffffffffffffff18,
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      QSharedMemoryPrivate::setUnixErrorString(in_RSI,(QLatin1StringView)shmid_ds.shm_perm._32_16_);
      local_79 = false;
    }
    else {
      memset(&local_78,0xaa,0x70);
      iVar1 = shmctl(iVar1,2,&local_78);
      if (iVar1 == 0) {
        in_RSI->size = local_78.shm_segsz;
        local_79 = true;
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_RSI,CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        QSharedMemoryPrivate::setUnixErrorString
                  (in_RSI,(QLatin1StringView)shmid_ds.shm_perm._32_16_);
        local_79 = false;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::attach(QSharedMemoryPrivate *self, QSharedMemory::AccessMode mode)
{
    // grab the shared memory segment id
    int id = shmget(unix_key, 0, (mode == QSharedMemory::ReadOnly ? 0400 : 0600));
    if (-1 == id) {
        self->setUnixErrorString("QSharedMemory::attach (shmget)"_L1);
        unix_key = 0;
        nativeKeyFile.clear();
        return false;
    }

    // grab the memory
    self->memory = shmat(id, nullptr, (mode == QSharedMemory::ReadOnly ? SHM_RDONLY : 0));
    if (self->memory == MAP_FAILED) {
        self->memory = nullptr;
        self->setUnixErrorString("QSharedMemory::attach (shmat)"_L1);
        return false;
    }

    // grab the size
    shmid_ds shmid_ds;
    if (!shmctl(id, IPC_STAT, &shmid_ds)) {
        self->size = (qsizetype)shmid_ds.shm_segsz;
    } else {
        self->setUnixErrorString("QSharedMemory::attach (shmctl)"_L1);
        return false;
    }

    return true;
}